

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void state_TEXLDL(Context *ctx)

{
  char *pcVar1;
  
  if (ctx->major_ver < 3) {
    pcVar1 = "TEXLDL in version < Shader Model 3.0";
  }
  else {
    if (ctx->source_args[1].regtype == REG_TYPE_SAMPLER) {
      if (ctx->source_args[1].regnum == 3) {
        ctx->instruction_count = ctx->instruction_count + 3;
      }
      return;
    }
    pcVar1 = "TEXLDL src1 must be sampler register";
  }
  failf(ctx,"%s",pcVar1);
  return;
}

Assistant:

static void state_TEXLDL(Context *ctx)
{
    if (!shader_version_atleast(ctx, 3, 0))
        fail(ctx, "TEXLDL in version < Shader Model 3.0");
    else if (ctx->source_args[1].regtype != REG_TYPE_SAMPLER)
        fail(ctx, "TEXLDL src1 must be sampler register");
    else
    {
        if ( ((TextureType) ctx->source_args[1].regnum) == TEXTURE_TYPE_CUBE )
            ctx->instruction_count += 3;
    } // else
}